

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Flt_t * Gia_SimQualityImpact(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vRareCounts)

{
  Vec_Wrd_t *pVVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Flt_t *p_00;
  Vec_Wrd_t *p_01;
  Vec_Wrd_t *p_02;
  word *pwVar7;
  float fVar8;
  float local_ac;
  int OrigVal;
  word *pSim_1;
  int RareVal;
  int RareObj;
  float Incrm;
  word *pSim;
  int RareCount;
  int RareLit;
  int Value;
  int k;
  int i;
  Vec_Wrd_t *vSims;
  Vec_Wrd_t *vTemp;
  Vec_Wrd_t *vSimsPiNew;
  int nWordsNew;
  Vec_Flt_t *vQuoIncs;
  Vec_Int_t *vRareCounts_local;
  Vec_Int_t *vPat_local;
  Gia_Man_t *p_local;
  
  iVar3 = Gia_ManCiNum(p);
  p_00 = Vec_FltStart(iVar3);
  iVar3 = Gia_ManCiNum(p);
  iVar3 = Abc_Bit6WordNum(iVar3 + 1);
  iVar4 = Gia_ManCiNum(p);
  p_01 = Vec_WrdStart(iVar4 * iVar3);
  iVar4 = Vec_IntSize(vPat);
  iVar5 = Gia_ManCiNum(p);
  if (iVar4 == iVar5) {
    for (Value = 0; iVar4 = Vec_IntSize(vPat), Value < iVar4; Value = Value + 1) {
      iVar4 = Vec_IntEntry(vPat,Value);
      pwVar7 = Vec_WrdEntryP(p_01,Value * iVar3);
      if (iVar4 != 0) {
        Abc_TtFill(pwVar7,iVar3);
      }
      Abc_TtXorBit(pwVar7,Value + 1);
    }
    pVVar1 = p->vSimsPi;
    p->vSimsPi = p_01;
    p_02 = Gia_ManSimPatSim(p);
    p->vSimsPi = pVVar1;
    for (Value = 0; iVar4 = Vec_IntSize(vRareCounts), Value + 1 < iVar4; Value = Value + 2) {
      iVar4 = Vec_IntEntry(vRareCounts,Value);
      iVar5 = Vec_IntEntry(vRareCounts,Value + 1);
      fVar8 = 1.0 / (float)(iVar5 + 1);
      iVar5 = Abc_Lit2Var(iVar4);
      uVar6 = Abc_LitIsCompl(iVar4);
      pwVar7 = Vec_WrdEntryP(p_02,iVar5 * iVar3);
      uVar2 = *pwVar7;
      if ((uVar2 & 1) != 0) {
        Abc_TtNot(pwVar7,iVar3);
      }
      for (RareLit = 0; iVar4 = Gia_ManCiNum(p), RareLit < iVar4; RareLit = RareLit + 1) {
        iVar4 = Abc_TtGetBit(pwVar7,RareLit + 1);
        if (iVar4 != 0) {
          local_ac = fVar8;
          if (((uint)uVar2 & 1) == uVar6) {
            local_ac = -fVar8;
          }
          Vec_FltAddToEntry(p_00,RareLit,local_ac);
        }
      }
    }
    Vec_WrdFree(p_02);
    Vec_WrdFree(p_01);
    return p_00;
  }
  __assert_fail("Vec_IntSize(vPat) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x71f,"Vec_Flt_t *Gia_SimQualityImpact(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Flt_t * Gia_SimQualityImpact( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vRareCounts )
{
    Vec_Flt_t * vQuoIncs = Vec_FltStart( Gia_ManCiNum(p) );
    int nWordsNew = Abc_Bit6WordNum( 1+Gia_ManCiNum(p) );
    Vec_Wrd_t * vSimsPiNew = Vec_WrdStart( Gia_ManCiNum(p) * nWordsNew );
    Vec_Wrd_t * vTemp, * vSims;
    int i, k, Value, RareLit, RareCount;
    assert( Vec_IntSize(vPat) == Gia_ManCiNum(p) );
    Vec_IntForEachEntry( vPat, Value, i )
    {
        word * pSim = Vec_WrdEntryP( vSimsPiNew, i*nWordsNew );
        if ( Value )
            Abc_TtFill( pSim, nWordsNew );
        Abc_TtXorBit( pSim, i+1 );
    }
    vTemp = p->vSimsPi;
    p->vSimsPi = vSimsPiNew;
    vSims = Gia_ManSimPatSim( p );
    p->vSimsPi = vTemp;
    Vec_IntForEachEntryDouble( vRareCounts, RareLit, RareCount, i )
    {
        float Incrm = (float)1.0/(RareCount+1);
        int RareObj = Abc_Lit2Var(RareLit);
        int RareVal = Abc_LitIsCompl(RareLit);
        word * pSim = Vec_WrdEntryP( vSims, RareObj*nWordsNew );
        int OrigVal = pSim[0] & 1;
        if ( OrigVal )
            Abc_TtNot( pSim, nWordsNew );
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            if ( Abc_TtGetBit(pSim, k+1) ) // value changed
                Vec_FltAddToEntry( vQuoIncs, k, OrigVal != RareVal ? Incrm : -Incrm );
    }
    Vec_WrdFree( vSims );
    Vec_WrdFree( vSimsPiNew );
    return vQuoIncs;
}